

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::TextureSamplerCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  char *pcVar1;
  ostringstream buf;
  ostream local_190;
  
  if (*(int *)((long)this + 0x84) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "#version 300 es\nin highp vec4 a_pos;\nin highp vec4 a_attr;\nout highp vec4 v_attr;\nvoid main ()\n{\n\tv_attr = a_attr;\n\tgl_Position = a_pos;\n}\n"
               ,(allocator<char> *)&local_190);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::operator<<(&local_190,"#version 300 es\nin highp vec4 a_pos;\nin highp vec2 a_attr;\n");
    pcVar1 = "uniform highp sampler2D u_sampler;\n";
    if (*(int *)((long)this + 0x88) == 3) {
      pcVar1 = "uniform highp samplerCube u_sampler;\n";
    }
    std::operator<<(&local_190,pcVar1);
    std::operator<<(&local_190,"out mediump vec4 v_out;\nvoid main ()\n{\n");
    if ((ulong)*(uint *)((long)this + 0x88) < 4) {
      std::operator<<(&local_190,
                      &DAT_0187f388 +
                      *(int *)(&DAT_0187f388 + (ulong)*(uint *)((long)this + 0x88) * 4));
    }
    std::operator<<(&local_190,"\n\tgl_Position = a_pos;\n}\n");
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSamplerCase::genVertexSource (void) const
{
	// vertex shader is passthrough, fragment does the calculations
	if (m_type == TYPE_FRAGMENT)
		return s_attrPassthroughVertexShaderSource;

	// vertex shader does the calculations
	std::ostringstream buf;
	buf <<	"#version 300 es\n"
			"in highp vec4 a_pos;\n"
			"in highp vec2 a_attr;\n";

	if (m_testType != TEST_TEX_COORD_CUBE)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else
		buf <<	"uniform highp samplerCube u_sampler;\n";

	buf <<	"out mediump vec4 v_out;\n"
			"void main ()\n"
			"{\n";

	if (m_testType == TEST_TEX_COORD)
		buf <<	"	v_out = textureLod(u_sampler, a_attr, 0.0);\n";
	else if (m_testType == TEST_LOD)
		buf <<	"	v_out = textureLod(u_sampler, a_attr, a_attr.x);\n";
	else if (m_testType == TEST_GRAD)
		buf <<	"	v_out = textureGrad(u_sampler, a_attr, a_attr, a_attr.yx);\n";
	else if (m_testType == TEST_TEX_COORD_CUBE)
		buf <<	"	v_out = textureLod(u_sampler, vec3(a_attr, a_attr.x + a_attr.y), 0.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"\n"
			"	gl_Position = a_pos;\n"
			"}\n";

	return buf.str();
}